

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::persistence_computer_t
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,directed_flag_complex_in_memory_computer_t *_complex,
          output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
          *_output,size_t _max_entries,int _modulus,value_t _max_filtration)

{
  value_type_conflict5 *__val;
  pointer psVar1;
  logic_error *this_00;
  
  this->complex = _complex;
  this->output = _output;
  this->max_filtration = _max_filtration;
  this->max_entries = _max_entries;
  this->euler_characteristic = 0;
  this->print_betti_numbers_to_console = true;
  this->modulus = 2;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (pointer)operator_new(4);
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = psVar1;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar1;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = psVar1 + 2;
  psVar1[0] = 0;
  psVar1[1] = 0;
  (this->multiplicative_inverse).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar1 + 2;
  psVar1[1] = 1;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->columns_to_reduce).
  super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>::_M_initialize_map
            (&(this->columns_to_reduce).
              super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>,0);
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->birth_deaths_by_dim).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->birth_deaths_by_dim).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->betti_numbers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->birth_deaths_by_dim).
  super__Vector_base<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->betti_numbers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->betti_numbers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (_modulus == 2) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"If you want to use modulus != 2, please compile with coefficients.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

persistence_computer_t(Complex& _complex, output_t<Complex>* _output,
	                       size_t _max_entries = std::numeric_limits<size_t>::max(), int _modulus = 2,
	                       value_t _max_filtration = std::numeric_limits<value_t>::max())
	    : complex(_complex), output(_output), max_filtration(_max_filtration), max_entries(_max_entries),
#ifdef USE_COEFFICIENTS
	      modulus(_modulus),
#endif
	      multiplicative_inverse(multiplicative_inverse_vector(modulus)) {
#ifndef USE_COEFFICIENTS
		if (_modulus != 2) {
			throw std::logic_error("If you want to use modulus != 2, please compile with coefficients.");
		}
#endif
	}